

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_compute_blob.h
# Opt level: O1

void ncnn::gridsample_2d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  size_t sVar6;
  size_t sVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  long lVar10;
  uint uVar11;
  uint in_R10D;
  byte bVar12;
  uint uVar13;
  int iVar14;
  float *pfVar15;
  long lVar16;
  uint *puVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  int iVar21;
  float fVar22;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  int iVar23;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  void *local_80;
  
  iVar14 = grid->h * grid->w;
  puVar17 = (uint *)offset_value->data;
  if (permute_fusion == 0) {
    if (0 < grid->c) {
      local_80 = grid->data;
      sVar6 = grid->cstep;
      sVar7 = grid->elemsize;
      lVar10 = 0;
      do {
        if (0 < iVar14) {
          lVar16 = 0;
          do {
            uVar3 = *(undefined8 *)((long)local_80 + lVar16 * 4);
            uVar5 = src->w;
            uVar9 = src->h;
            fVar18 = ((float)uVar3 * 0.5 + 0.5) * (float)(int)uVar5 + -0.5;
            fVar22 = ((float)((ulong)uVar3 >> 0x20) * 0.5 + 0.5) * (float)(int)uVar9 + -0.5;
            fVar19 = floorf(fVar18);
            fVar20 = floorf(fVar22);
            iVar21 = (int)fVar19;
            iVar23 = (int)fVar20;
            iVar1 = iVar21 + 1;
            iVar2 = iVar23 + 1;
            auVar27._0_4_ = -(uint)(-1 < iVar21);
            auVar27._4_4_ = -(uint)(-1 < iVar23);
            auVar27._8_4_ = -(uint)(-1 < (int)extraout_XMM0_Db_01);
            auVar27._12_4_ = -(uint)(-1 < (int)extraout_XMM0_Db_02);
            auVar31._0_4_ = -(uint)(iVar21 < (int)uVar5);
            auVar31._4_4_ = -(uint)(iVar23 < (int)uVar9);
            auVar31._8_4_ = -(uint)((int)extraout_XMM0_Db_01 < 0);
            auVar31._12_4_ = -(uint)((int)extraout_XMM0_Db_02 < 0);
            auVar31 = auVar31 & auVar27;
            auVar28._0_8_ = auVar31._0_8_;
            auVar28._8_4_ = auVar31._4_4_;
            auVar28._12_4_ = auVar31._12_4_;
            auVar29._0_8_ = auVar28._0_8_ << 0x3f;
            auVar29._8_8_ = auVar28._8_8_ << 0x3f;
            in_R10D = movmskpd(in_R10D,auVar29);
            bVar12 = (byte)in_R10D >> 1;
            in_R10D = in_R10D & 1;
            *puVar17 = -(uint)((bVar12 & in_R10D) == 0) | (uVar5 * iVar23 + iVar21) * src->elempack;
            uVar13 = 0xffffffff;
            uVar11 = 0xffffffff;
            if (((iVar1 < (int)uVar5 && -2 < iVar21) & bVar12) != 0) {
              uVar11 = (iVar23 * src->w + iVar1) * src->elempack;
            }
            puVar17[1] = uVar11;
            if (((-2 < iVar23 && iVar2 < (int)uVar9) & in_R10D) != 0) {
              uVar13 = (src->w * iVar2 + iVar21) * src->elempack;
            }
            puVar17[2] = uVar13;
            if ((-2 < iVar23 && iVar2 < (int)uVar9) && (iVar1 < (int)uVar5 && -2 < iVar21)) {
              uVar11 = (iVar2 * src->w + iVar1) * src->elempack;
            }
            else {
              uVar11 = 0xffffffff;
            }
            puVar17[3] = uVar11;
            *(ulong *)(puVar17 + 4) = CONCAT44(fVar22 - (float)iVar23,fVar18 - (float)iVar21);
            puVar17 = puVar17 + 6;
            lVar16 = lVar16 + 2;
          } while ((int)lVar16 < iVar14);
        }
        lVar10 = lVar10 + 1;
        local_80 = (void *)((long)local_80 + sVar6 * sVar7);
      } while (lVar10 < grid->c);
    }
  }
  else if (0 < iVar14) {
    sVar6 = grid->elemsize;
    sVar7 = grid->cstep;
    pfVar15 = (float *)grid->data;
    do {
      uVar4 = src->w;
      uVar8 = src->h;
      fVar18 = (*pfVar15 * 0.5 + 0.5) * (float)(int)uVar4 + -0.5;
      fVar22 = (*(float *)((long)pfVar15 + sVar6 * sVar7) * 0.5 + 0.5) * (float)(int)uVar8 + -0.5;
      fVar19 = floorf(fVar18);
      fVar20 = floorf(fVar22);
      iVar21 = (int)fVar19;
      iVar23 = (int)fVar20;
      iVar1 = iVar21 + 1;
      iVar2 = iVar23 + 1;
      auVar24._0_4_ = -(uint)(-1 < iVar21);
      auVar24._4_4_ = -(uint)(-1 < iVar23);
      auVar24._8_4_ = -(uint)(-1 < (int)extraout_XMM0_Db);
      auVar24._12_4_ = -(uint)(-1 < (int)extraout_XMM0_Db_00);
      auVar30._0_4_ = -(uint)(iVar21 < (int)uVar4);
      auVar30._4_4_ = -(uint)(iVar23 < (int)uVar8);
      auVar30._8_4_ = -(uint)((int)extraout_XMM0_Db < 0);
      auVar30._12_4_ = -(uint)((int)extraout_XMM0_Db_00 < 0);
      auVar30 = auVar30 & auVar24;
      auVar25._0_8_ = auVar30._0_8_;
      auVar25._8_4_ = auVar30._4_4_;
      auVar25._12_4_ = auVar30._12_4_;
      auVar26._0_8_ = auVar25._0_8_ << 0x3f;
      auVar26._8_8_ = auVar25._8_8_ << 0x3f;
      in_R10D = movmskpd(in_R10D,auVar26);
      bVar12 = (byte)in_R10D >> 1;
      in_R10D = in_R10D & 1;
      *puVar17 = -(uint)((bVar12 & in_R10D) == 0) | (uVar4 * iVar23 + iVar21) * src->elempack;
      uVar13 = 0xffffffff;
      uVar11 = 0xffffffff;
      if (((iVar1 < (int)uVar4 && -2 < iVar21) & bVar12) != 0) {
        uVar11 = (iVar23 * src->w + iVar1) * src->elempack;
      }
      puVar17[1] = uVar11;
      if (((-2 < iVar23 && iVar2 < (int)uVar8) & in_R10D) != 0) {
        uVar13 = (src->w * iVar2 + iVar21) * src->elempack;
      }
      puVar17[2] = uVar13;
      if ((-2 < iVar23 && iVar2 < (int)uVar8) && (iVar1 < (int)uVar4 && -2 < iVar21)) {
        uVar11 = (iVar2 * src->w + iVar1) * src->elempack;
      }
      else {
        uVar11 = 0xffffffff;
      }
      puVar17[3] = uVar11;
      *(ulong *)(puVar17 + 4) = CONCAT44(fVar22 - (float)iVar23,fVar18 - (float)iVar21);
      pfVar15 = pfVar15 + 1;
      puVar17 = puVar17 + 6;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  return;
}

Assistant:

void gridsample_2d_bilinear_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h;

    float* offset_value_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 15 < grid_size; x += 16)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);

                transpose2x8_ps(gx, gy);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                __m256 x_w = _mm256_floor_ps(gx);
                __m256 y_n = _mm256_floor_ps(gy);

                __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
                __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));

                __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
                __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
                __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
                __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));

                __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
                __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
                __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
                __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

                __m256 nw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w), _mm256_set1_ps(src.elempack));
                __m256 ne_offset = _mm256_add_ps(nw_offset, _mm256_set1_ps(src.elempack));
                __m256 sw_offset = _mm256_comp_fmadd_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack), nw_offset);
                __m256 se_offset = _mm256_add_ps(sw_offset, _mm256_set1_ps(src.elempack));

                nw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), nw_offset, v00_in_range);
                ne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), ne_offset, v01_in_range);
                sw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), sw_offset, v10_in_range);
                se_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), se_offset, v11_in_range);

                nw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(nw_offset));
                ne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(ne_offset));
                sw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(sw_offset));
                se_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(se_offset));

                __m256 alpha = _mm256_sub_ps(gx, x_w);
                __m256 beta = _mm256_sub_ps(gy, y_n);

                transpose8x6_ps(nw_offset, ne_offset, sw_offset, se_offset, alpha, beta);

                _mm256_storeu_ps(offset_value_ptr, nw_offset);
                _mm256_storeu_ps(offset_value_ptr + 8, ne_offset);
                _mm256_storeu_ps(offset_value_ptr + 16, sw_offset);
                _mm256_storeu_ps(offset_value_ptr + 24, se_offset);

                _mm256_storeu_ps(offset_value_ptr + 32, alpha);
                _mm256_storeu_ps(offset_value_ptr + 40, beta);

                gridptr += 16;
                offset_value_ptr += 48;
            }
#endif // __AVX__

            for (; x < grid_size; x += 2)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                int x0 = (int)floorf(sample_x);
                int y0 = (int)floorf(sample_y);
                int x1 = x0 + 1;
                int y1 = y0 + 1;

                bool x0_in_bound = (x0 > -1) & (x0 < src.w);
                bool x1_in_bound = (x1 > -1) & (x1 < src.w);
                bool y0_in_bound = (y0 > -1) & (y0 < src.h);
                bool y1_in_bound = (y1 > -1) & (y1 < src.h);

                bool in_bound_00 = x0_in_bound & y0_in_bound;
                bool in_bound_01 = x1_in_bound & y0_in_bound;
                bool in_bound_10 = x0_in_bound & y1_in_bound;
                bool in_bound_11 = x1_in_bound & y1_in_bound;

                int* offset_ptr = (int*)offset_value_ptr;
                float* value_ptr = offset_value_ptr + 4;

                offset_ptr[0] = in_bound_00 ? (x0 + y0 * src.w) * src.elempack : -1.0;
                offset_ptr[1] = in_bound_01 ? (x1 + y0 * src.w) * src.elempack : -1.0;
                offset_ptr[2] = in_bound_10 ? (x0 + y1 * src.w) * src.elempack : -1.0;
                offset_ptr[3] = in_bound_11 ? (x1 + y1 * src.w) * src.elempack : -1.0;

                value_ptr[0] = sample_x - x0;
                value_ptr[1] = sample_y - y0;

                gridptr += 2;
                offset_value_ptr += 6;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            __m256 x_w = _mm256_floor_ps(gx);
            __m256 y_n = _mm256_floor_ps(gy);

            __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
            __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));

            __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
            __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
            __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
            __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));

            __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
            __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
            __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
            __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

            __m256 nw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w), _mm256_set1_ps(src.elempack));
            __m256 ne_offset = _mm256_add_ps(nw_offset, _mm256_set1_ps(src.elempack));
            __m256 sw_offset = _mm256_comp_fmadd_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack), nw_offset);
            __m256 se_offset = _mm256_add_ps(sw_offset, _mm256_set1_ps(src.elempack));

            nw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), nw_offset, v00_in_range);
            ne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), ne_offset, v01_in_range);
            sw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), sw_offset, v10_in_range);
            se_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), se_offset, v11_in_range);

            nw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(nw_offset));
            ne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(ne_offset));
            sw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(sw_offset));
            se_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(se_offset));

            __m256 alpha = _mm256_sub_ps(gx, x_w);
            __m256 beta = _mm256_sub_ps(gy, y_n);

            transpose8x6_ps(nw_offset, ne_offset, sw_offset, se_offset, alpha, beta);

            _mm256_storeu_ps(offset_value_ptr, nw_offset);
            _mm256_storeu_ps(offset_value_ptr + 8, ne_offset);
            _mm256_storeu_ps(offset_value_ptr + 16, sw_offset);
            _mm256_storeu_ps(offset_value_ptr + 24, se_offset);

            _mm256_storeu_ps(offset_value_ptr + 32, alpha);
            _mm256_storeu_ps(offset_value_ptr + 40, beta);

            gridptr_x += 8;
            gridptr_y += 8;
            offset_value_ptr += 48;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            int x0 = (int)floorf(sample_x);
            int y0 = (int)floorf(sample_y);
            int x1 = x0 + 1;
            int y1 = y0 + 1;

            bool x0_in_bound = (x0 > -1) & (x0 < src.w);
            bool x1_in_bound = (x1 > -1) & (x1 < src.w);
            bool y0_in_bound = (y0 > -1) & (y0 < src.h);
            bool y1_in_bound = (y1 > -1) & (y1 < src.h);

            bool in_bound_00 = x0_in_bound & y0_in_bound;
            bool in_bound_01 = x1_in_bound & y0_in_bound;
            bool in_bound_10 = x0_in_bound & y1_in_bound;
            bool in_bound_11 = x1_in_bound & y1_in_bound;

            int* offset_ptr = (int*)offset_value_ptr;
            float* value_ptr = offset_value_ptr + 4;

            offset_ptr[0] = in_bound_00 ? (x0 + y0 * src.w) * src.elempack : -1.0;
            offset_ptr[1] = in_bound_01 ? (x1 + y0 * src.w) * src.elempack : -1.0;
            offset_ptr[2] = in_bound_10 ? (x0 + y1 * src.w) * src.elempack : -1.0;
            offset_ptr[3] = in_bound_11 ? (x1 + y1 * src.w) * src.elempack : -1.0;

            value_ptr[0] = sample_x - x0;
            value_ptr[1] = sample_y - y0;

            gridptr_x++;
            gridptr_y++;
            offset_value_ptr += 6;
        }
    }
}